

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_scan_block_scalar_breaks
              (yaml_parser_t *parser,int *indent,yaml_string_t *breaks,yaml_mark_t start_mark,
              yaml_mark_t *end_mark)

{
  yaml_char_t **pointer;
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  byte bVar3;
  yaml_char_t yVar4;
  byte *pbVar5;
  yaml_char_t *pyVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  end_mark->column = (parser->mark).column;
  sVar8 = (parser->mark).line;
  end_mark->index = (parser->mark).index;
  end_mark->line = sVar8;
  pointer = &breaks->pointer;
  iVar11 = 0;
  do {
    sVar8 = parser->unread;
    while( true ) {
      if ((sVar8 == 0) && (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 == 0)) {
        return 0;
      }
      iVar7 = *indent;
      if (((iVar7 != 0) && (iVar7 <= (int)(parser->mark).column)) ||
         (pbVar5 = (parser->buffer).pointer, *pbVar5 != 0x20)) break;
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar8 = parser->unread - 1;
      parser->unread = sVar8;
      bVar3 = *pbVar5;
      lVar12 = 1;
      if ((((char)bVar3 < '\0') && (lVar12 = 2, (bVar3 & 0xe0) != 0xc0)) &&
         (lVar12 = 3, (bVar3 & 0xf0) != 0xe0)) {
        lVar12 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar5 + lVar12;
    }
    iVar10 = (int)(parser->mark).column;
    if (iVar11 <= iVar10) {
      iVar11 = iVar10;
    }
    if ((iVar10 < iVar7 || iVar7 == 0) && (*(parser->buffer).pointer == '\t')) {
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a block scalar";
      (parser->context_mark).index = start_mark.index;
      (parser->context_mark).line = start_mark.line;
      (parser->context_mark).column = start_mark.column;
      parser->problem = "found a tab character where an indentation space is expected";
      sVar8 = (parser->mark).line;
      (parser->problem_mark).index = (parser->mark).index;
      (parser->problem_mark).line = sVar8;
      (parser->problem_mark).column = (parser->mark).column;
      return 0;
    }
    pyVar6 = (parser->buffer).pointer;
    yVar4 = *pyVar6;
    if (((yVar4 != '\n') && (yVar4 != '\r')) && ((yVar4 != 0xc2 || (pyVar6[1] != 0x85)))) {
      if (iVar7 != 0) {
        return 1;
      }
      *indent = iVar11;
      if (iVar11 <= parser->indent) {
        *indent = parser->indent + 1;
      }
      if (*indent < 1) {
        *indent = 1;
        return 1;
      }
      return 1;
    }
    if ((parser->unread < 2) && (iVar7 = yaml_parser_update_buffer(parser,2), iVar7 == 0)) {
      return 0;
    }
    if ((breaks->end <= *pointer + 5) &&
       (iVar7 = yaml_string_extend(&breaks->start,pointer,&breaks->end), iVar7 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pbVar5 = (parser->buffer).pointer;
    bVar3 = *pbVar5;
    if (bVar3 < 0xc2) {
      if (bVar3 == 10) {
LAB_001ba604:
        pyVar6 = *pointer;
        *pointer = pyVar6 + 1;
        *pyVar6 = '\n';
        ppyVar2 = &(parser->buffer).pointer;
        *ppyVar2 = *ppyVar2 + 1;
LAB_001ba6ce:
        lVar12 = -1;
        lVar9 = 1;
      }
      else {
        if (bVar3 != 0xd) goto LAB_001ba6fa;
        if (pbVar5[1] != 10) goto LAB_001ba604;
        pyVar6 = *pointer;
        *pointer = pyVar6 + 1;
        *pyVar6 = '\n';
        ppyVar2 = &(parser->buffer).pointer;
        *ppyVar2 = *ppyVar2 + 2;
        lVar12 = -2;
        lVar9 = 2;
      }
      (parser->mark).index = (parser->mark).index + lVar9;
      (parser->mark).column = 0;
      psVar1 = &(parser->mark).line;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread + lVar12;
    }
    else if ((bVar3 == 0xc2) && (pbVar5[1] == 0x85)) {
      pyVar6 = *pointer;
      *pointer = pyVar6 + 1;
      *pyVar6 = '\n';
      ppyVar2 = &(parser->buffer).pointer;
      *ppyVar2 = *ppyVar2 + 2;
      goto LAB_001ba6ce;
    }
LAB_001ba6fa:
    end_mark->column = (parser->mark).column;
    sVar8 = (parser->mark).line;
    end_mark->index = (parser->mark).index;
    end_mark->line = sVar8;
  } while( true );
}

Assistant:

static int
yaml_parser_scan_block_scalar_breaks(yaml_parser_t *parser,
        int *indent, yaml_string_t *breaks,
        yaml_mark_t start_mark, yaml_mark_t *end_mark)
{
    int max_indent = 0;

    *end_mark = parser->mark;

    /* Eat the indentation spaces and line breaks. */

    while (1)
    {
        /* Eat the indentation spaces. */

        if (!CACHE(parser, 1)) return 0;

        while ((!*indent || (int)parser->mark.column < *indent)
                && IS_SPACE(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) return 0;
        }

        if ((int)parser->mark.column > max_indent)
            max_indent = (int)parser->mark.column;

        /* Check for a tab character messing the indentation. */

        if ((!*indent || (int)parser->mark.column < *indent)
                && IS_TAB(parser->buffer)) {
            return yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                    start_mark, "found a tab character where an indentation space is expected");
        }

        /* Have we found a non-empty line? */

        if (!IS_BREAK(parser->buffer)) break;

        /* Consume the line break. */

        if (!CACHE(parser, 2)) return 0;
        if (!READ_LINE(parser, *breaks)) return 0;
        *end_mark = parser->mark;
    }

    /* Determine the indentation level if needed. */

    if (!*indent) {
        *indent = max_indent;
        if (*indent < parser->indent + 1)
            *indent = parser->indent + 1;
        if (*indent < 1)
            *indent = 1;
    }

   return 1;
}